

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.h
# Opt level: O3

char * __thiscall GEO::Delaunay::index(Delaunay *this,char *__s,int __c)

{
  char *pcVar1;
  string local_30;
  
  if ((char *)(ulong)this->cell_size_ != (char *)0x0) {
    pcVar1 = (char *)0x0;
    do {
      if (this->cell_to_v_[(int)__s * this->cell_v_stride_ + (int)pcVar1] == __c) {
        return pcVar1;
      }
      pcVar1 = pcVar1 + 1;
    } while ((char *)(ulong)this->cell_size_ != pcVar1);
  }
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.h"
             ,"");
  geo_should_not_have_reached(&local_30,0x19b0);
}

Assistant:

index_t index(index_t c, signed_index_t v) const {
            geo_debug_assert(c < nb_cells());
            geo_debug_assert(v < (signed_index_t) nb_vertices());
            for(index_t iv = 0; iv < cell_size(); iv++) {
                if(cell_vertex(c, iv) == v) {
                    return iv;
                }
            }
            geo_assert_not_reached;
        }